

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<unsigned_char> * __thiscall
kj::ArrayBuilder<unsigned_char>::operator=
          (ArrayBuilder<unsigned_char> *this,ArrayBuilder<unsigned_char> *other)

{
  uchar *puVar1;
  RemoveConst<unsigned_char> *pRVar2;
  uchar *puVar3;
  ArrayDisposer *pAVar4;
  
  puVar1 = this->ptr;
  if (puVar1 != (uchar *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (uchar *)0x0;
    this->pos = (RemoveConst<unsigned_char> *)0x0;
    this->endPtr = (uchar *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,puVar1,1,(long)pRVar2 - (long)puVar1,(long)puVar3 - (long)puVar1,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (uchar *)0x0;
  other->pos = (RemoveConst<unsigned_char> *)0x0;
  other->endPtr = (uchar *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }